

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

void __thiscall
kj::MainBuilder::MainImpl::wrapText
          (MainImpl *this,Vector<char> *output,StringPtr indent,StringPtr text)

{
  RemoveConst<char> **ppRVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  ulong uVar4;
  RemoveConst<char> *pRVar5;
  void *pvVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  RemoveConst<char> *pRVar10;
  size_t sVar11;
  RemoveConst<char> *pRVar12;
  char *__s;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  size_t local_68;
  
  local_68 = text.content.size_;
  __s = text.content.ptr;
  pcVar8 = indent.content.ptr;
  sVar14 = local_68 - 1;
  if (sVar14 != 0) {
    uVar7 = 0x51 - (int)indent.content.size_;
    __n = indent.content.size_ - 1;
    uVar4 = (ulong)uVar7;
    pRVar12 = (output->builder).pos;
    do {
      pcVar2 = (output->builder).ptr;
      pcVar3 = (output->builder).endPtr;
      pRVar5 = pRVar12 + (__n - (long)pcVar2);
      pRVar10 = pcVar3 + -(long)pcVar2;
      if (pRVar10 < pRVar5) {
        pRVar10 = (RemoveConst<char> *)((long)pRVar10 * 2);
        if (pcVar3 == pcVar2) {
          pRVar10 = (RemoveConst<char> *)0x4;
        }
        if (pRVar10 < pRVar5) {
          pRVar10 = pRVar5;
        }
        Vector<char>::setCapacity(output,(size_t)pRVar10);
        pRVar12 = (output->builder).pos;
      }
      if (pcVar8 + (indent.content.size_ - 1) != pcVar8) {
        memcpy(pRVar12,pcVar8,__n);
        pRVar12 = pRVar12 + __n;
      }
      (output->builder).pos = pRVar12;
      pvVar6 = memchr(__s,10,sVar14);
      if ((pvVar6 == (void *)0x0) || (uVar15 = (long)pvVar6 - (long)__s, uVar4 < uVar15)) {
        uVar15 = local_68 - 1;
        if (uVar15 <= uVar4) {
          pcVar8 = (output->builder).ptr;
          pcVar2 = (output->builder).endPtr;
          pRVar10 = pRVar12 + (local_68 - (long)pcVar8) + -1;
          pRVar5 = pcVar2 + -(long)pcVar8;
          if (pRVar5 < pRVar10) {
            pRVar12 = (RemoveConst<char> *)0x4;
            if (pcVar2 != pcVar8) {
              pRVar12 = (RemoveConst<char> *)((long)pRVar5 * 2);
            }
            if (pRVar12 < pRVar10) {
              pRVar12 = pRVar10;
            }
            Vector<char>::setCapacity(output,(size_t)pRVar12);
            pRVar12 = (output->builder).pos;
          }
          if (__s != __s + (local_68 - 1)) {
            memcpy(pRVar12,__s,uVar15);
            pRVar12 = pRVar12 + uVar15;
          }
          (output->builder).pos = pRVar12;
          if (pRVar12 == (output->builder).endPtr) {
            pRVar10 = (output->builder).ptr;
            sVar11 = 4;
            if (pRVar12 != pRVar10) {
              sVar11 = ((long)pRVar12 - (long)pRVar10) * 2;
            }
            Vector<char>::setCapacity(output,sVar11);
            pRVar12 = (output->builder).pos;
          }
          *pRVar12 = '\n';
          ppRVar1 = &(output->builder).pos;
          *ppRVar1 = *ppRVar1 + 1;
          return;
        }
        uVar15 = uVar4;
        uVar9 = uVar4;
        uVar13 = 0;
        if ((int)indent.content.size_ != 0x51) {
          do {
            if ((__s[uVar9] == ' ') && (__s[uVar9 - 1] != ' ')) {
              uVar15 = uVar9;
              uVar13 = (uint)uVar9;
              break;
            }
            uVar9 = uVar9 - 1;
            uVar13 = uVar7;
          } while ((int)uVar9 != 0);
        }
        pcVar2 = (output->builder).ptr;
        pcVar3 = (output->builder).endPtr;
        pRVar5 = pRVar12 + (uVar15 - (long)pcVar2);
        pRVar10 = pcVar3 + -(long)pcVar2;
        if (pRVar10 < pRVar5) {
          pRVar10 = (RemoveConst<char> *)((long)pRVar10 * 2);
          if (pcVar3 == pcVar2) {
            pRVar10 = (RemoveConst<char> *)0x4;
          }
          if (pRVar10 < pRVar5) {
            pRVar10 = pRVar5;
          }
          Vector<char>::setCapacity(output,(size_t)pRVar10);
          pRVar12 = (output->builder).pos;
        }
        if (uVar13 != 0) {
          memcpy(pRVar12,__s,uVar15);
          pRVar12 = pRVar12 + uVar15;
        }
        (output->builder).pos = pRVar12;
        if (pRVar12 == (output->builder).endPtr) {
          pRVar10 = (output->builder).ptr;
          sVar11 = ((long)pRVar12 - (long)pRVar10) * 2;
          if (pRVar12 == pRVar10) {
            sVar11 = 4;
          }
          Vector<char>::setCapacity(output,sVar11);
          pRVar12 = (output->builder).pos;
        }
        *pRVar12 = '\n';
        pRVar12 = (output->builder).pos + 1;
        (output->builder).pos = pRVar12;
        do {
          uVar15 = (ulong)uVar13;
          uVar13 = uVar13 + 1;
        } while (__s[uVar15] == ' ');
        sVar14 = (size_t)((uVar13 + (__s[uVar15] == '\n')) - 1);
      }
      else {
        pcVar2 = (output->builder).ptr;
        pcVar3 = (output->builder).endPtr;
        pRVar5 = pRVar12 + (uVar15 - (long)pcVar2) + 1;
        pRVar10 = pcVar3 + -(long)pcVar2;
        if (pRVar10 < pRVar5) {
          pRVar10 = (RemoveConst<char> *)((long)pRVar10 * 2);
          if (pcVar3 == pcVar2) {
            pRVar10 = (RemoveConst<char> *)0x4;
          }
          if (pRVar10 < pRVar5) {
            pRVar10 = pRVar5;
          }
          Vector<char>::setCapacity(output,(size_t)pRVar10);
          pRVar12 = (output->builder).pos;
        }
        sVar14 = uVar15 + 1;
        memcpy(pRVar12,__s,sVar14);
        pRVar12 = pRVar12 + sVar14;
        (output->builder).pos = pRVar12;
      }
      local_68 = local_68 - sVar14;
      __s = __s + sVar14;
      sVar14 = local_68 - 1;
    } while (sVar14 != 0);
  }
  return;
}

Assistant:

void MainBuilder::MainImpl::wrapText(Vector<char>& output, StringPtr indent, StringPtr text) {
  uint width = 80 - indent.size();

  while (text.size() > 0) {
    output.addAll(indent);

    KJ_IF_SOME(lineEnd, text.findFirst('\n')) {
      if (lineEnd <= width) {
        output.addAll(text.first(lineEnd + 1));
        text = text.slice(lineEnd + 1);
        continue;
      }
    }

    if (text.size() <= width) {
      output.addAll(text);
      output.add('\n');
      break;
    }

    uint wrapPos = width;
    for (;; wrapPos--) {
      if (wrapPos == 0) {
        // Hmm, no good place to break words.  Just break in the middle.
        wrapPos = width;
        break;
      } else if (text[wrapPos] == ' ' && text[wrapPos - 1] != ' ') {
        // This position is a space and is preceded by a non-space.  Wrap here.
        break;
      }
    }

    output.addAll(text.first(wrapPos));
    output.add('\n');

    // Skip spaces after the text that was printed.
    while (text[wrapPos] == ' ') {
      ++wrapPos;
    }
    if (text[wrapPos] == '\n') {
      // Huh, apparently there were a whole bunch of spaces at the end of the line followed by a
      // newline.  Skip the newline as well so we don't print a blank line.
      ++wrapPos;
    }
    text = text.slice(wrapPos);
  }
}